

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int intGetOption(char *message)

{
  int iVar1;
  string local_30 [8];
  string temp;
  char *message_local;
  
  std::__cxx11::string::string(local_30);
  std::operator<<((ostream *)&std::cout,message);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
  iVar1 = std::__cxx11::stoi((string *)local_30,(size_t *)0x0,10);
  std::__cxx11::string::~string(local_30);
  return iVar1;
}

Assistant:

int intGetOption(const char *message){
	std::string temp;
	std::cout << message;
	std::getline(std::cin, temp);
	return std::stoi(temp);
}